

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O2

bool duckdb::TryDecimalStringCast<duckdb::hugeint_t,(char)46>
               (char *string_ptr,idx_t string_size,hugeint_t *result,CastParameters *parameters,
               uint8_t width,uint8_t scale)

{
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  undefined7 in_register_00000081;
  undefined3 in_register_00000089;
  uint uVar7;
  uint params_2;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  idx_t iVar11;
  allocator local_f1;
  char *local_f0;
  int local_e8;
  uint local_e4;
  ulong local_e0;
  ExponentData exponent;
  string_t value;
  DecimalCastData<duckdb::hugeint_t> local_a8;
  hugeint_t *local_80;
  CastParameters *local_78;
  string local_70;
  string local_50 [32];
  
  uVar7 = CONCAT31(in_register_00000089,scale);
  params_2 = uVar7;
  local_80 = result;
  local_78 = parameters;
  hugeint_t::hugeint_t(&local_a8.result,0);
  local_a8.digit_count = '\0';
  local_a8.decimal_count = '\0';
  local_a8.round_set = false;
  local_a8.should_round = false;
  local_e8 = (int)CONCAT71(in_register_00000081,width);
  local_a8.excessive_decimals = '\0';
  local_a8.exponent_type = NONE;
  local_a8.limit.lower = *(uint64_t *)(Hugeint::POWERS_OF_TEN + (uint)(local_e8 << 4));
  local_a8.limit.upper = *(int64_t *)(Hugeint::POWERS_OF_TEN + (ulong)(uint)(local_e8 << 4) + 8);
  for (uVar10 = 0; uVar8 = string_size - uVar10, local_e4 = uVar7, local_a8.width = width,
      local_a8.scale = scale, uVar8 != 0; uVar10 = uVar10 + 1) {
    bVar2 = string_ptr[uVar10];
    if ((4 < bVar2 - 9) && (bVar2 != 0x20)) {
      if (bVar2 == 0x2d) {
        uVar9 = string_size - uVar10;
        uVar8 = 1;
        goto LAB_00265fe8;
      }
      if (bVar2 != 0x30 || string_size - 1 == uVar10) {
LAB_002660c3:
        uVar4 = (ulong)(bVar2 == 0x2b);
        uVar9 = uVar4;
        goto LAB_002660d2;
      }
      bVar1 = (bool)string_ptr[uVar10 + 1];
      if (bVar1 != true) {
        if (bVar1 != true) {
          if (bVar1 == true) goto LAB_00266218;
          if (bVar1 != true) goto LAB_002660c3;
        }
        bVar1 = IntegerHexCastLoop<duckdb::DecimalCastData<duckdb::hugeint_t>,false,false,duckdb::DecimalCastOperation>
                          (string_ptr + uVar10 + 1,~uVar10 + string_size,&local_a8,bVar1);
        goto LAB_002660b6;
      }
LAB_00266218:
      if (0xfffffffffffffffd < (string_size - uVar10) - 3) {
        DecimalCastOperation::Finalize<duckdb::DecimalCastData<duckdb::hugeint_t>,false>(&local_a8);
      }
      break;
    }
  }
  goto LAB_00266551;
  while( true ) {
    bVar2 = string_ptr[uVar10 + uVar4];
    if (9 < (byte)(bVar2 - 0x30)) {
      if (bVar2 != 0x2e) goto LAB_00266318;
      uVar8 = uVar4 + 1;
      uVar5 = uVar8;
      goto LAB_00266186;
    }
    bVar1 = DecimalCastOperation::HandleDigit<duckdb::DecimalCastData<duckdb::hugeint_t>,true>
                      (&local_a8,bVar2 - 0x30);
    if ((!bVar1) ||
       (((uVar8 = uVar9, ~uVar4 + string_size != uVar10 &&
         (uVar8 = uVar4 + 1, string_ptr[uVar10 + 1 + uVar4] == '_')) &&
        (((string_size - uVar4) - 2 == uVar10 ||
         (uVar8 = uVar4 + 2, 9 < (byte)(string_ptr[uVar10 + 2 + uVar4] - 0x30U))))))) break;
LAB_00265fe8:
    uVar4 = uVar8;
    if (uVar9 <= uVar4) goto LAB_00266154;
  }
  goto LAB_00266551;
LAB_00266186:
  uVar3 = uVar5;
  if (uVar9 <= uVar3) {
    bVar1 = 1 < uVar4;
    uVar4 = uVar3;
    if (uVar8 < uVar3 || bVar1) goto LAB_00266154;
    goto LAB_00266551;
  }
  local_f0 = string_ptr + uVar3;
  bVar2 = local_f0[uVar10];
  if (9 < (byte)(bVar2 - 0x30)) {
    bVar1 = 1 < uVar4;
    uVar4 = uVar3;
    if (uVar8 < uVar3 || bVar1) goto LAB_00266318;
    goto LAB_00266551;
  }
  bVar1 = DecimalCastOperation::HandleDecimal<duckdb::DecimalCastData<duckdb::hugeint_t>,true,true>
                    (&local_a8,bVar2 - 0x30);
  if ((!bVar1) ||
     (((uVar5 = uVar9, ~uVar3 + string_size != uVar10 &&
       (uVar5 = uVar3 + 1, local_f0[uVar10 + 1] == '_')) &&
      (((string_size - uVar3) - 2 == uVar10 ||
       (uVar5 = uVar3 + 2, 9 < (byte)(local_f0[uVar10 + 2] - 0x30U))))))) goto LAB_00266551;
  goto LAB_00266186;
LAB_00266318:
  if (4 < bVar2 - 9) {
    if ((bVar2 == 0x65) || (bVar2 == 0x45)) {
      if ((uVar4 == 1) || (uVar9 <= uVar4 + 1)) goto LAB_00266551;
      exponent.result = 0;
      pcVar6 = string_ptr + uVar10 + uVar4 + 1;
      iVar11 = ~uVar10 + (string_size - uVar4);
      if (*pcVar6 == '-') {
        bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                          (pcVar6,iVar11,&exponent,false);
      }
      else {
        bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                          (pcVar6,iVar11,&exponent,false);
      }
      if (bVar1 == false) goto LAB_00266551;
      bVar1 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<duckdb::hugeint_t>,true>
                        (&local_a8,(int)exponent.result);
      goto LAB_002660b6;
    }
    if (bVar2 != 0x20) goto LAB_00266551;
  }
  uVar8 = uVar4 + 1;
  uVar4 = uVar8;
  if (uVar8 < uVar9) {
    uVar4 = uVar9;
  }
  for (; uVar8 < uVar9; uVar8 = uVar8 + 1) {
    if ((0x20 < (ulong)(byte)string_ptr[uVar10 + uVar8]) ||
       ((0x100003e00U >> ((ulong)(byte)string_ptr[uVar10 + uVar8] & 0x3f) & 1) == 0))
    goto LAB_00266551;
  }
LAB_00266154:
  bVar1 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<duckdb::hugeint_t>,true>(&local_a8)
  ;
  if ((bVar1) && (1 < uVar4)) goto LAB_0026625b;
  goto LAB_00266551;
LAB_00266283:
  uVar3 = uVar9;
  if (uVar8 <= uVar3) {
    bVar1 = uVar4 < uVar5;
    uVar5 = uVar3;
    if (local_e0 < uVar3 || bVar1) goto LAB_0026623e;
    goto LAB_00266551;
  }
  local_f0 = string_ptr + uVar3;
  bVar2 = local_f0[uVar10];
  if (9 < (byte)(bVar2 - 0x30)) {
    bVar1 = uVar4 < uVar5;
    uVar5 = uVar3;
    if (local_e0 < uVar3 || bVar1) goto LAB_00266370;
    goto LAB_00266551;
  }
  bVar1 = DecimalCastOperation::HandleDecimal<duckdb::DecimalCastData<duckdb::hugeint_t>,false,true>
                    (&local_a8,bVar2 - 0x30);
  if ((!bVar1) ||
     (((uVar9 = uVar8, ~uVar3 + string_size != uVar10 &&
       (uVar9 = uVar3 + 1, local_f0[uVar10 + 1] == '_')) &&
      (((string_size - uVar3) - 2 == uVar10 ||
       (uVar9 = uVar3 + 2, 9 < (byte)(local_f0[uVar10 + 2] - 0x30U))))))) goto LAB_00266551;
  goto LAB_00266283;
LAB_00266370:
  if (4 < bVar2 - 9) {
    if ((bVar2 == 0x65) || (bVar2 == 0x45)) {
      if ((uVar5 == uVar4) || (uVar8 <= uVar5 + 1)) goto LAB_00266551;
      exponent.result = 0;
      pcVar6 = string_ptr + uVar10 + uVar5 + 1;
      iVar11 = ~uVar10 + (string_size - uVar5);
      if (*pcVar6 == '-') {
        bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                          (pcVar6,iVar11,&exponent,false);
      }
      else {
        bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                          (pcVar6,iVar11,&exponent,false);
      }
      if (bVar1 == false) goto LAB_00266551;
      bVar1 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<duckdb::hugeint_t>,false>
                        (&local_a8,(int)exponent.result);
LAB_002660b6:
      if (bVar1 != false) goto LAB_0026625b;
      goto LAB_00266551;
    }
    if (bVar2 != 0x20) goto LAB_00266551;
  }
  uVar9 = uVar5 + 1;
  uVar5 = uVar9;
  if (uVar9 < uVar8) {
    uVar5 = uVar8;
  }
  for (; uVar9 < uVar8; uVar9 = uVar9 + 1) {
    if ((0x20 < (ulong)(byte)string_ptr[uVar10 + uVar9]) ||
       ((0x100003e00U >> ((ulong)(byte)string_ptr[uVar10 + uVar9] & 0x3f) & 1) == 0))
    goto LAB_00266551;
  }
LAB_0026623e:
  bVar1 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<duckdb::hugeint_t>,false>
                    (&local_a8);
  if ((bVar1) && (uVar4 < uVar5)) {
LAB_0026625b:
    local_80->lower = local_a8.result.lower;
    local_80->upper = local_a8.result.upper;
    return true;
  }
  goto LAB_00266551;
  while( true ) {
    bVar2 = string_ptr[uVar10 + uVar5];
    if (9 < (byte)(bVar2 - 0x30)) {
      if (bVar2 != 0x2e) goto LAB_00266370;
      local_e0 = uVar5 + 1;
      uVar9 = local_e0;
      goto LAB_00266283;
    }
    bVar1 = DecimalCastOperation::HandleDigit<duckdb::DecimalCastData<duckdb::hugeint_t>,false>
                      (&local_a8,bVar2 - 0x30);
    if ((!bVar1) ||
       (((uVar9 = uVar8, ~uVar5 + string_size != uVar10 &&
         (uVar9 = uVar5 + 1, string_ptr[uVar10 + 1 + uVar5] == '_')) &&
        (((string_size - uVar5) - 2 == uVar10 ||
         (uVar9 = uVar5 + 2, 9 < (byte)(string_ptr[uVar10 + 2 + uVar5] - 0x30U))))))) break;
LAB_002660d2:
    uVar5 = uVar9;
    if (uVar8 <= uVar5) goto LAB_0026623e;
  }
LAB_00266551:
  value.value.pointer.length = (uint32_t)string_size;
  if (value.value.pointer.length < 0xd) {
    value.value._12_4_ = 0;
    value.value._4_1_ = '\0';
    value.value._5_1_ = '\0';
    value.value._6_1_ = '\0';
    value.value._7_1_ = '\0';
    value.value._8_4_ = 0;
    value.value.pointer.ptr = (char *)0x0;
    if (value.value.pointer.length != 0) {
      switchD_00916250::default
                ((void *)((long)&value.value + 4),string_ptr,
                 (ulong)(value.value.pointer.length & 0xf));
      value.value.pointer.ptr = (char *)CONCAT44(value.value._12_4_,value.value._8_4_);
    }
  }
  else {
    value.value.pointer.prefix = (char  [4])*(undefined4 *)string_ptr;
    value.value.pointer.ptr = string_ptr;
  }
  ::std::__cxx11::string::string
            (local_50,"Could not convert string \"%s\" to DECIMAL(%d,%d)",&local_f1);
  string_t::GetString_abi_cxx11_(&local_70,&value);
  StringUtil::Format<std::__cxx11::string,int,int>
            ((string *)&exponent,(StringUtil *)local_50,&local_70,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (ulong)(byte)local_e8,local_e4 & 0xff,params_2);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string(local_50);
  HandleCastError::AssignError((string *)&exponent,local_78);
  ::std::__cxx11::string::~string((string *)&exponent);
  return false;
}

Assistant:

bool TryDecimalStringCast(const char *string_ptr, idx_t string_size, T &result, CastParameters &parameters,
                          uint8_t width, uint8_t scale) {
	DecimalCastData<T> state;
	state.result = 0;
	state.width = width;
	state.scale = scale;
	state.digit_count = 0;
	state.decimal_count = 0;
	state.excessive_decimals = 0;
	state.exponent_type = ExponentType::NONE;
	state.round_set = false;
	state.should_round = false;
	state.limit = UnsafeNumericCast<T>(DecimalCastTraits<T>::POWERS_OF_TEN_CLASS::POWERS_OF_TEN[width]);
	if (!TryIntegerCast<DecimalCastData<T>, true, true, DecimalCastOperation, false, decimal_separator>(
	        string_ptr, string_size, state, false)) {
		string_t value(string_ptr, (uint32_t)string_size);
		string error = StringUtil::Format("Could not convert string \"%s\" to DECIMAL(%d,%d)", value.GetString(),
		                                  (int)width, (int)scale);
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	result = state.result;
	return true;
}